

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void __thiscall cmState::AddUnexpectedCommand(cmState *this,string *name,char *error)

{
  cmUnexpectedCommand *this_00;
  string local_40;
  
  this_00 = (cmUnexpectedCommand *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  cmUnexpectedCommand::cmUnexpectedCommand(this_00,&local_40,error);
  AddBuiltinCommand(this,name,(cmCommand *)this_00);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmState::AddUnexpectedCommand(std::string const& name, const char* error)
{
  this->AddBuiltinCommand(name, new cmUnexpectedCommand(name, error));
}